

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzDD::ArchiveIN(ChNodeFEAxyzDD *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  undefined ***local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::fea::ChNodeFEAxyzDD>(marchive);
  ChNodeFEAxyzD::ArchiveIN(&this->super_ChNodeFEAxyzD,marchive);
  local_38 = (ChVector<double> *)&(this->super_ChNodeFEAxyzD).field_0x140;
  local_58 = "DD";
  local_48 = 0;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->DD_dt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "DD_dt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->DD_dtdt;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "DD_dtdt";
  local_48 = 0;
  local_50 = &local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  return;
}

Assistant:

void ChNodeFEAxyzDD::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyzDD>();
    // deserialize parent class
    ChNodeFEAxyzD::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(DD);
    marchive >> CHNVP(DD_dt);
    marchive >> CHNVP(DD_dtdt);
}